

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall JsonNumber_Int64Min_Test::JsonNumber_Int64Min_Test(JsonNumber_Int64Min_Test *this)

{
  JsonNumber_Int64Min_Test *this_local;
  
  anon_unknown.dwarf_ccab2::JsonNumber::JsonNumber(&this->super_JsonNumber);
  (this->super_JsonNumber).super_Test._vptr_Test =
       (_func_int **)&PTR__JsonNumber_Int64Min_Test_0025a5f0;
  return;
}

Assistant:

TEST_F (JsonNumber, Int64Min) {
    PSTORE_ASSERT (int64_min_str == std::to_string (int64_min) &&
                   "The hard-wired signed 64-bit min string seems to be incorrect");
    EXPECT_CALL (callbacks_, int64_value (int64_min)).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (std::string{int64_min_str}).eof ();
    EXPECT_FALSE (p.has_error ());
}